

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void prof_firestart(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long in_RDI;
  int dur;
  OBJ_DATA *fire;
  short sect;
  void *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  CHAR_DATA *in_stack_fffffffffffffd98;
  int npulse;
  char *in_stack_fffffffffffffda0;
  CHAR_DATA *ch_00;
  allocator<char> *in_stack_fffffffffffffdc0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdc8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [36];
  undefined1 local_1a4 [28];
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [24];
  char_data **in_stack_fffffffffffffeb8;
  _func_void_char_data_ptr_int *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  CQueue *in_stack_fffffffffffffee0;
  allocator<char> local_111;
  int *in_stack_fffffffffffffef0;
  char (*in_stack_ffffffffffffff18) [58];
  char (*args) [59];
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
  *in_stack_ffffffffffffff20;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr *func;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  CQueue *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  string *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  CQueue *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  char_data **in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  void **in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  allocator<char> local_49;
  string local_48 [36];
  undefined4 local_24;
  long local_20;
  short local_12;
  long local_8;
  
  local_8 = in_RDI;
  bVar1 = is_affected_prof(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (bVar1) {
    send_to_char(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  }
  else {
    local_12 = *(short *)(*(long *)(local_8 + 0xa8) + 0x150);
    if ((((local_12 == 6) || (local_12 == 8)) || (local_12 == 0x11)) ||
       (((local_12 == 9 || (local_12 == 1)) || (local_12 == 7)))) {
      send_to_char(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    else {
      for (local_20 = *(long *)(*(long *)(local_8 + 0xa8) + 0x20); local_20 != 0;
          local_20 = *(long *)(local_20 + 8)) {
        if (*(short *)(local_20 + 0x98) == 0x22) {
          send_to_char(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          return;
        }
      }
      if (*(short *)(local_8 + 0x162) < *(short *)(local_8 + 0x138)) {
        send_to_char(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
      else {
        local_24 = 0xc;
        act(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
            in_stack_fffffffffffffd88,0);
        act(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
            in_stack_fffffffffffffd88,0);
        *(short *)(local_8 + 0x162) =
             *(short *)(local_8 + 0x162) - (short)*(undefined4 *)(local_8 + 0x138);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[58],char_data*&>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (char_data **)in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator(&local_49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        func = (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
                *)0x0;
        args = (char (*) [59])0x0;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[56],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  ((CQueue *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                    *)in_stack_ffffffffffffff40,
                   (char (*) [56])CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (char_data **)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff88);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_111;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        __s = &stack0xfffffffffffffec7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,__s,in_stack_fffffffffffffdc0);
        CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28,func,args,(char_data **)in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
        std::allocator<char>::~allocator(&local_111);
        __a = &local_161;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
        local_1a4._12_8_ = 0;
        local_1a4._4_8_ = 0;
        local_1a4._0_4_ = 0;
        ch_00 = (CHAR_DATA *)local_1a4;
        npulse = (int)((ulong)(local_1a4 + 4) >> 0x20);
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                   (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                    *)in_stack_ffffffffffffff50,(char (*) [57])in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff98);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)(local_1a4 + 0x1b));
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator(&local_161);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
        CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffef0);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        WAIT_STATE(ch_00,npulse);
      }
    }
  }
  return;
}

Assistant:

void prof_firestart(CHAR_DATA *ch, char *argument)
{
	if (is_affected_prof(ch, "firestarting"))
	{
		send_to_char("You cannot start another fire yet.\n\r", ch);
		return;
	}

	auto sect = ch->in_room->sector_type;
	if (sect == SECT_WATER || sect == SECT_UNDERWATER || sect == SECT_VERTICAL || sect == SECT_AIR || sect == SECT_CITY || sect == SECT_INSIDE)
	{
		send_to_char("You can't build a fire here.\n\r",ch);
		return;
	}

	for (auto fire = ch->in_room->contents; fire; fire = fire->next_content)
	{
		if (fire->item_type == ITEM_CAMPFIRE)
		{
			send_to_char("There is already a fire burning here.\n\r", ch);
			return;
		}
	}

	if (ch->move < ch->level)
	{
		send_to_char("You are too tired to gather wood.\n\r", ch);
		return;
	}

	auto dur = 12;
	act("You begin to build a campfire, gathering sticks and twigs from your surroundings.", ch, 0, 0, TO_CHAR);
	act("$n begins to build a campfire, gathering sticks and twigs from $s surroundings.", ch, 0, 0, TO_ROOM);
	ch->move -= ch->level;

	RS.Queue.AddToQueue(1, "prof_firestart", "send_to_char_queue", send_to_char_queue, "You rub two sticks together, trying to produce a flame.\n\r", ch);
	RS.Queue.AddToQueue(1, "prof_firestart", "act_queue", act_queue, "$n rubs two sticks together, trying to produce a flame.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(3, "prof_firestart", "send_to_char_queue", send_to_char_queue, "The sticks begin to smoke, and soon you produce a spark.\n\r", ch);
	RS.Queue.AddToQueue(3, "prof_firestart", "act_queue", act_queue, "The sticks begin to smoke, and soon $n produces a spark.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(5, "prof_firestart", "build_fire", build_fire, ch, dur);
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}